

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_grammar.cpp
# Opt level: O1

int Omega_h::find_goal_symbol(Grammar *g)

{
  _Rb_tree_header *p_Var1;
  int *piVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  const_reference pvVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  int i;
  int *piVar8;
  _Rb_tree_header *p_Var9;
  pointer pPVar10;
  int i_00;
  int iVar11;
  int s;
  set<int,_std::less<int>,_std::allocator<int>_> nonterminals_in_rhss;
  int local_6c;
  pointer local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pPVar10 = (g->productions).
            super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_68 = (g->productions).
             super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pPVar10 != local_68) {
    do {
      piVar2 = (pPVar10->rhs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar8 = (pPVar10->rhs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar8 != piVar2; piVar8 = piVar8 + 1) {
        local_6c = *piVar8;
        if (local_6c < 0) {
          fail("assertion %s failed at %s +%d\n","0 <= s",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_grammar.cpp"
               ,0x1f);
        }
        bVar4 = is_terminal(g,local_6c);
        if (!bVar4) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_60,&local_6c);
        }
      }
      pPVar10 = pPVar10 + 1;
    } while (pPVar10 != local_68);
  }
  i = g->nterminals;
  iVar11 = -1;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  if (i < g->nsymbols) {
    p_Var7 = &p_Var1->_M_header;
    p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    i_00 = -1;
    do {
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[(int)*(size_t *)(p_Var3 + 1) < i]) {
        if (i <= (int)*(size_t *)(p_Var3 + 1)) {
          p_Var7 = p_Var3;
        }
      }
      p_Var9 = p_Var1;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (p_Var9 = (_Rb_tree_header *)p_Var7, i < (int)((_Rb_tree_header *)p_Var7)->_M_node_count))
      {
        p_Var9 = p_Var1;
      }
      iVar11 = i_00;
      if ((p_Var9 == p_Var1) && (iVar11 = i, i_00 != -1)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ERROR: there is more than one root nonterminal (",0x30);
        pvVar5 = at<std::__cxx11::string>(&g->symbol_names,i_00);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(pvVar5->_M_dataplus)._M_p,
                            pvVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," and ",5);
        pvVar5 = at<std::__cxx11::string>(&g->symbol_names,i);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(pvVar5->_M_dataplus)._M_p,pvVar5->_M_string_length);
        std::operator<<(poVar6,") in this grammar\n");
        goto LAB_002d747d;
      }
      i = i + 1;
      p_Var7 = &p_Var1->_M_header;
      p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      i_00 = iVar11;
    } while (i != g->nsymbols);
  }
  if (iVar11 != -1) {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_60);
    return iVar11;
  }
  std::operator<<((ostream *)&std::cerr,"ERROR: the root nonterminal is unclear for this grammar\n")
  ;
LAB_002d747d:
  abort();
}

Assistant:

int find_goal_symbol(Grammar const& g) {
  std::set<int> nonterminals_in_rhss;
  for (auto& p : g.productions) {
    for (auto s : p.rhs) {
      OMEGA_H_CHECK(0 <= s);
      if (is_nonterminal(g, s)) nonterminals_in_rhss.insert(s);
    }
  }
  int result = -1;
  for (int s = g.nterminals; s < g.nsymbols; ++s)
    if (!nonterminals_in_rhss.count(s)) {
      if (result != -1) {
        std::cerr << "ERROR: there is more than one root nonterminal (";
        std::cerr << at(g.symbol_names, result) << " and "
                  << at(g.symbol_names, s) << ") in this grammar\n";
        abort();
      }
      result = s;
    }
  if (result == -1) {
    std::cerr << "ERROR: the root nonterminal is unclear for this grammar\n";
    abort();
  }
  return result;
}